

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O0

void __thiscall SystemCatalog::SystemCatalog(SystemCatalog *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  ostream *this_00;
  SystemCatalog *__nbytes;
  undefined1 local_560 [8];
  type _type;
  int i;
  int offset;
  allocator local_4c9;
  string local_4c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  fstream local_488 [535];
  allocator local_271;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  fstream local_230 [544];
  SystemCatalog *local_10;
  SystemCatalog *this_local;
  
  local_10 = this;
  std::set<type,_std::less<type>,_std::allocator<type>_>::set(&this->types);
  std::fstream::fstream(&this->catalogFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"data/",&local_271);
  std::operator+(local_250,(char *)local_270);
  _Var2 = std::operator|(_S_in,_S_out);
  _Var2 = std::operator|(_Var2,_S_bin);
  std::fstream::fstream(local_230,(string *)local_250,_Var2);
  std::fstream::operator=(&this->catalogFile,local_230);
  std::fstream::~fstream(local_230);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  bVar1 = std::ios::operator!((ios *)(&this->catalogFile +
                                     *(long *)(*(long *)&this->catalogFile + -0x18)));
  if ((bVar1 & 1) != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "SystemCatalog file could not be found or read, creating a new one");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    createCatalogFile(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"data/",&local_4c9);
    std::operator+(local_4a8,(char *)local_4c8);
    _Var2 = std::operator|(_S_in,_S_out);
    _Var2 = std::operator|(_Var2,_S_bin);
    std::fstream::fstream(local_488,(string *)local_4a8,_Var2);
    std::fstream::operator=(&this->catalogFile,local_488);
    std::fstream::~fstream(local_488);
    std::__cxx11::string::~string((string *)local_4a8);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  }
  std::istream::read((char *)&this->catalogFile,(long)this);
  memset(&i,0,0x30);
  std::set<type,_std::less<type>,_std::allocator<type>_>::set
            ((set<type,_std::less<type>,_std::allocator<type>_> *)&i);
  std::set<type,_std::less<type>,_std::allocator<type>_>::operator=
            (&this->types,(set<type,_std::less<type>,_std::allocator<type>_> *)&i);
  std::set<type,_std::less<type>,_std::allocator<type>_>::~set
            ((set<type,_std::less<type>,_std::allocator<type>_> *)&i);
  _type.dir._4_4_ = 4;
  for (_type.dir._0_4_ = 0; (int)_type.dir < this->numTypes; _type.dir._0_4_ = (int)_type.dir + 1) {
    __nbytes = this;
    type::type((type *)local_560);
    type::read((type *)local_560,(int)this + 0x38,(void *)(ulong)_type.dir._4_4_,(size_t)__nbytes);
    std::set<type,_std::less<type>,_std::allocator<type>_>::insert
              (&this->types,(value_type *)local_560);
    iVar3 = calcTypeSize((uint)(byte)_type._24_1_);
    _type.dir._4_4_ = iVar3 + _type.dir._4_4_;
    type::~type((type *)local_560);
  }
  return;
}

Assistant:

SystemCatalog::SystemCatalog() {
    catalogFile = fstream(ROOT + "SystemCatalog", INOUTBIN);

    if (!catalogFile) {
        cout << "SystemCatalog file could not be found or read, creating a new one" << endl;

        this->createCatalogFile();

        catalogFile = fstream(ROOT + "SystemCatalog", INOUTBIN);
    }

    catalogFile.read((char *) &numTypes, NUM_TYPES);

    types = set<type>();

    int offset = NUM_TYPES;

    for (int i = 0; i < numTypes; ++i) {

        type _type = type();

        _type.read(catalogFile, offset);

        types.insert(_type);

        offset += calcTypeSize(_type.numFields);
    }
}